

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O1

void __thiscall
adios2::transport::FileFStream::Open
          (FileFStream *this,string *name,Mode openMode,bool async,bool directio)

{
  string *__rhs;
  pointer pcVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _State_baseV2 *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result_base *p_Var5;
  long *plVar6;
  size_type *psVar7;
  _Ios_Openmode _Var8;
  element_type *peVar9;
  element_type *peVar10;
  string *process;
  bool bVar11;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  undefined1 local_178 [32];
  __basic_future<void> local_158;
  long *local_140;
  undefined **local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  (this->super_Transport).m_OpenMode = openMode;
  _Var8 = (_Ios_Openmode)name;
  if (openMode == Append) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"open","");
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    std::fstream::open((string *)&this->m_FileStream,_Var8);
    std::ostream::seekp((long)&this->field_0x100,_S_beg);
    peVar10 = (element_type *)&local_b0.field_2;
    process = &local_b0;
    local_b0._M_dataplus._M_p = (pointer)peVar10;
LAB_00647038:
    std::__cxx11::string::_M_construct<char_const*>((string *)process,"open","");
    Transport::ProfilerStop(&this->super_Transport,process);
    peVar9 = (element_type *)(process->_M_dataplus)._M_p;
    if (peVar9 == peVar10) goto LAB_00647058;
  }
  else {
    if (openMode == Read) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      std::fstream::open((string *)&this->m_FileStream,_Var8);
      peVar10 = (element_type *)&local_f0.field_2;
      process = &local_f0;
      local_f0._M_dataplus._M_p = (pointer)peVar10;
      goto LAB_00647038;
    }
    if (openMode == Write) {
      if (async) {
        this->m_IsOpening = true;
        local_178._0_8_ = (element_type *)0x0;
        local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
        p_Var4->_M_use_count = 1;
        p_Var4->_M_weak_count = 1;
        p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00885738;
        peVar10 = (element_type *)(p_Var4 + 1);
        p_Var4[2]._M_use_count = 0;
        p_Var4[1]._M_use_count = 0;
        p_Var4[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
        p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var4[3]._M_use_count = 0;
        p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00885788;
        p_Var5 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)p_Var5 = 0;
        *(undefined8 *)(p_Var5 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(p_Var5);
        local_138 = &PTR__M_destroy_008847f8;
        *(undefined ***)p_Var5 = &PTR__M_destroy_008847f8;
        p_Var4[4]._vptr__Sp_counted_base = (_func_int **)p_Var5;
        *(_Atomic_word **)&p_Var4[4]._M_use_count = &p_Var4[5]._M_use_count;
        pcVar1 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&p_Var4[4]._M_use_count,pcVar1,pcVar1 + name->_M_string_length);
        *(FileFStream **)&p_Var4[6]._M_use_count = this;
        local_158._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_140 = (long *)operator_new(0x20);
        *local_140 = (long)&PTR___State_008857e0;
        local_140[1] = (long)peVar10;
        local_140[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
                             ::_M_run;
        local_140[3] = 0;
        std::thread::_M_start_thread(&local_158,&local_140,0);
        if (local_140 != (long *)0x0) {
          (**(code **)(*local_140 + 8))();
        }
        uVar2 = local_178._8_8_;
        if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
          std::terminate();
        }
        p_Var4[3]._vptr__Sp_counted_base =
             (_func_int **)
             local_158._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        bVar11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_178._0_8_ = peVar10;
        local_178._8_8_ = p_Var4;
        if (bVar11) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_178._0_8_ == (element_type *)0x0) {
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
          p_Var4->_M_use_count = 1;
          p_Var4->_M_weak_count = 1;
          p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00885820;
          p_Var4[2]._M_use_count = 0;
          p_Var4[1]._M_use_count = 0;
          p_Var4[1]._M_weak_count = 0;
          *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
          p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00885870;
          p_Var5 = (_Result_base *)operator_new(0x10);
          *(undefined8 *)p_Var5 = 0;
          *(undefined8 *)(p_Var5 + 8) = 0;
          std::__future_base::_Result_base::_Result_base(p_Var5);
          *(undefined ***)p_Var5 = local_138;
          p_Var4[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
          *(_Atomic_word **)&p_Var4[3]._M_use_count = &p_Var4[4]._M_use_count;
          pcVar1 = (name->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&p_Var4[3]._M_use_count,pcVar1,pcVar1 + name->_M_string_length);
          uVar2 = local_178._8_8_;
          *(FileFStream **)&p_Var4[5]._M_use_count = this;
          bVar11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_178._0_8_ = (element_type *)(p_Var4 + 1);
          local_178._8_8_ = p_Var4;
          if (bVar11) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
          }
        }
        std::__basic_future<void>::__basic_future(&local_158,(__state_type *)local_178);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
        }
        _Var3._M_pi = local_158._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        peVar10 = local_158._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        local_158._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_158._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var4 = (this->m_OpenFuture).super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->m_OpenFuture).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar10;
        (this->m_OpenFuture).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var3._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        if (local_158._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        goto LAB_00647058;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::fstream::open((string *)&this->m_FileStream,_Var8);
      peVar10 = (element_type *)&local_70.field_2;
      process = &local_70;
      local_70._M_dataplus._M_p = (pointer)peVar10;
      goto LAB_00647038;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   "unknown open mode for file ",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_110.field_2._M_allocated_capacity = *psVar7;
      local_110.field_2._8_8_ = plVar6[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar7;
      local_110._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_110._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CheckFile(this,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    peVar9 = (element_type *)local_178._0_8_;
    if ((element_type *)local_178._0_8_ == (element_type *)(local_178 + 0x10)) goto LAB_00647058;
  }
  operator_delete(peVar9);
LAB_00647058:
  if (this->m_IsOpening == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   "couldn\'t open file ",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_130.field_2._M_allocated_capacity = *psVar7;
      local_130.field_2._8_8_ = plVar6[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar7;
      local_130._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_130._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CheckFile(this,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FileFStream::Open(const std::string &name, const Mode openMode, const bool async,
                       const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> void {
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
        ProfilerStop("open");
    };
    m_Name = name;
    CheckName();
    m_OpenMode = openMode;

    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            ProfilerStart("open");
            m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::out | std::fstream::binary);
        m_FileStream.seekp(0, std::ios_base::end);
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::binary);
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to stream open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to fstream open");
        m_IsOpen = true;
    }
}